

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_identifier_name(parser *this,char *func,int line)

{
  int in_ECX;
  undefined4 in_register_00000014;
  wstring wStack_38;
  
  get_identifier_name_abi_cxx11_
            (&wStack_38,(parser *)func,(char *)CONCAT44(in_register_00000014,line),in_ECX);
  make_expression<mjs::identifier_expression,std::__cxx11::wstring>
            (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)func
            );
  std::__cxx11::wstring::~wstring((wstring *)&wStack_38);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parser::parse_identifier_name(const char* func, int line) {
    return make_expression<identifier_expression>(get_identifier_name(func, line));
}